

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall CUI::ApplyCursorAlign(CUI *this,CTextCursor *pCursor,CUIRect *pRect,int Align)

{
  float fVar1;
  float fVar2;
  
  pCursor->m_Align = Align;
  fVar1 = pRect->x;
  if ((Align & 3U) == 2) {
    fVar1 = fVar1 + pRect->w;
  }
  else if ((Align & 3U) == 1) {
    fVar1 = fVar1 + pRect->w * 0.5;
  }
  fVar2 = pRect->y;
  if ((Align & 0xcU) == 8) {
    fVar2 = fVar2 + pRect->h;
  }
  else if ((Align & 0xcU) == 4) {
    fVar2 = fVar2 + pRect->h * 0.5;
  }
  (pCursor->m_CursorPos).field_0.x = fVar1;
  (pCursor->m_CursorPos).field_1.y = fVar2;
  return;
}

Assistant:

void CUI::ApplyCursorAlign(class CTextCursor *pCursor, const CUIRect *pRect, int Align)
{
	pCursor->m_Align = Align;

	float x = pRect->x;
	if((Align & TEXTALIGN_MASK_HORI) == TEXTALIGN_CENTER)
		x += pRect->w / 2.0f;
	else if((Align & TEXTALIGN_MASK_HORI) == TEXTALIGN_RIGHT)
		x += pRect->w;

	float y = pRect->y;
	if((Align & TEXTALIGN_MASK_VERT) == TEXTALIGN_MIDDLE)
		y += pRect->h / 2.0f;
	else if((Align & TEXTALIGN_MASK_VERT) == TEXTALIGN_BOTTOM)
		y += pRect->h;

	pCursor->MoveTo(x, y);
}